

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O3

void CB_EXPLORE_ADF::predict_or_learn_regcb<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  wclass *pwVar1;
  float *pfVar2;
  float *pfVar3;
  bool bVar4;
  example *peVar5;
  ulong uVar6;
  pointer ppeVar7;
  pointer ppeVar8;
  size_t sVar9;
  
  peVar5 = test_adf_sequence(examples);
  if (peVar5 == (example *)0x0) {
    LEARNER::multiline_learn_or_predict<false>(base,examples,data->offset,0);
  }
  else {
    bVar4 = CB::ec_is_example_header
                      (*(examples->super__Vector_base<example_*,_std::allocator<example_*>_>).
                        _M_impl.super__Vector_impl_data._M_start);
    uVar6 = (ulong)bVar4;
    ppeVar7 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppeVar8 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (uVar6 < ((long)ppeVar8 - (long)ppeVar7 >> 3) - 1U) {
      do {
        pwVar1 = (ppeVar7[uVar6]->l).cs.costs._begin;
        if ((long)(ppeVar7[uVar6]->l).cs.costs._end - (long)pwVar1 == 0x10) {
          pwVar1->partial_prediction = 1.0;
          ppeVar7 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          ppeVar8 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < ((long)ppeVar8 - (long)ppeVar7 >> 3) - 1U);
    }
    LEARNER::multiline_learn_or_predict<true>(base,examples,data->offset,0);
  }
  peVar5 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pfVar2 = (peVar5->pred).scalars._end;
  pfVar3 = (peVar5->pred).scalars._begin;
  sVar9 = data->counter + 1;
  data->counter = sVar9;
  logf((float)(((ulong)((long)pfVar2 - (long)pfVar3) >> 3 & 0xffffffff) * sVar9));
  return;
}

Assistant:

void predict_or_learn_regcb(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  if (is_learn && test_adf_sequence(examples) != nullptr)
  {
    uint32_t shared = static_cast<uint32_t>(CB::ec_is_example_header(*examples[0]));
    for (size_t i = shared; i < examples.size() - 1; ++i)
    {
      CB::label& ld = examples[i]->l.cb;
      if (ld.costs.size() == 1)
        ld.costs[0].probability = 1.f;  // no importance weighting
    }

    multiline_learn_or_predict<true>(base, examples, data.offset);
  }
  else
    multiline_learn_or_predict<false>(base, examples, data.offset);

  v_array<action_score>& preds = examples[0]->pred.a_s;
  uint32_t num_actions = (uint32_t)preds.size();
  ++data.counter;

  const float max_range = data.max_cb_cost - data.min_cb_cost;
  // threshold on empirical loss difference
  const float delta = data.c0 * log((float)(num_actions * data.counter)) * pow(max_range, 2);

  if (!is_learn)
  {
    get_cost_ranges(data.min_costs, data.max_costs, delta, data, base, examples,
        /*min_only=*/data.regcbopt);

    if (data.regcbopt)  // optimistic variant
    {
      float min_cost = FLT_MAX;
      size_t a_opt = 0;  // optimistic action
      for (size_t a = 0; a < num_actions; ++a)
      {
        if (data.min_costs[a] < min_cost)
        {
          min_cost = data.min_costs[a];
          a_opt = a;
        }
      }
      for (size_t i = 0; i < preds.size(); ++i)
      {
        if (preds[i].action == a_opt || (!data.first_only && data.min_costs[preds[i].action] == min_cost))
          preds[i].score = 1;
        else
          preds[i].score = 0;
      }
    }
    else  // elimination variant
    {
      float min_max_cost = FLT_MAX;
      for (size_t a = 0; a < num_actions; ++a)
        if (data.max_costs[a] < min_max_cost)
          min_max_cost = data.max_costs[a];
      for (size_t i = 0; i < preds.size(); ++i)
      {
        if (data.min_costs[preds[i].action] <= min_max_cost)
          preds[i].score = 1;
        else
          preds[i].score = 0;
        // explore uniformly on support
        enforce_minimum_probability(1.0, /*update_zero_elements=*/false, begin_scores(preds), end_scores(preds));
      }
    }
  }
}